

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void benchmark::anon_unknown_1::RunInThread
               (Instance *b,size_t iters,int thread_id,ThreadStats *total)

{
  char cVar1;
  mutex_type *pmVar2;
  int iVar3;
  MutexLock l;
  State st;
  CheckHandler local_88;
  CheckHandler local_80;
  unique_lock<std::mutex> local_78;
  State local_68;
  
  State::State(&local_68,iters,b->has_arg1,b->arg1,b->has_arg2,b->arg2,thread_id);
  (*b->benchmark->_vptr_Benchmark[2])(b->benchmark,&local_68);
  if (local_68.total_iterations_ == local_68.max_iterations) {
    local_80.log_ = internal::GetNullLogInstance();
  }
  else {
    internal::CheckHandler::CheckHandler
              (&local_80,"st.iterations() == st.max_iterations",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
               ,"RunInThread",0x25c);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_80.log_,"Benchmark returned before State::KeepRunning() returned false!",0x3e);
  if (local_68.total_iterations_ != local_68.max_iterations) {
    internal::CheckHandler::~CheckHandler(&local_80);
  }
  if (GetBenchmarkLock()::lock == '\0') {
    _GLOBAL__N_1::RunInThread();
  }
  local_78._M_device = (mutex_type *)GetBenchmarkLock()::lock;
  local_78._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_78);
  local_78._M_owns = true;
  total->bytes_processed = total->bytes_processed + local_68.bytes_processed_;
  total->items_processed = total->items_processed + local_68.items_processed_;
  std::unique_lock<std::mutex>::~unique_lock(&local_78);
  pmVar2 = (anonymous_namespace)::timer_manager;
  local_78._M_device = (anonymous_namespace)::timer_manager;
  local_78._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_78);
  local_78._M_owns = true;
  iVar3 = *(int *)((long)&pmVar2[3].super___mutex_base._M_mutex + 0x18) + 1;
  *(int *)((long)&pmVar2[3].super___mutex_base._M_mutex + 0x18) = iVar3;
  if (iVar3 == pmVar2[2].super___mutex_base._M_mutex.__data.__owner) {
    cVar1 = pmVar2[2].super___mutex_base._M_mutex.__size[0x18];
    if (cVar1 == '\0') {
      local_88.log_ = internal::GetNullLogInstance();
    }
    else {
      internal::CheckHandler::CheckHandler
                (&local_88,"!running_",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                 ,"Finalize",0xb1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (local_88.log_,"The timer should be stopped before the timer is finalized",0x39);
    if (cVar1 != '\0') {
      internal::CheckHandler::~CheckHandler(&local_88);
    }
    Notification::Notify(*(Notification **)((long)&pmVar2[2].super___mutex_base._M_mutex + 0x10));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_78);
  return;
}

Assistant:

EXCLUDES(GetBenchmarkLock()) {
  State st(iters, b->has_arg1, b->arg1, b->has_arg2, b->arg2, thread_id);
  b->benchmark->Run(st);
  CHECK(st.iterations() == st.max_iterations) <<
    "Benchmark returned before State::KeepRunning() returned false!";
  {
    MutexLock l(GetBenchmarkLock());
    total->bytes_processed += st.bytes_processed();
    total->items_processed += st.items_processed();
  }

  timer_manager->Finalize();
}